

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osutils.cpp
# Opt level: O3

void * asmjit::OSUtils::allocVirtualMemory(size_t size,size_t *allocated,uint32_t flags)

{
  int iVar1;
  void *pvVar2;
  ulong __len;
  void *pvVar3;
  
  if (_ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_0 == 0) {
    iVar1 = getpagesize();
    _ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_0 = (ulong)iVar1;
    _ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_1 = 0x10000;
    if (0x10000 < _ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_0) {
      _ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_1 = _ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_0;
    }
  }
  __len = -_ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_0 &
          (size - 1) + _ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_0;
  pvVar2 = mmap((void *)0x0,__len,(flags * 2 & 4) + 1 + (flags & 1) * 2,0x22,-1,0);
  pvVar3 = (void *)0x0;
  if ((pvVar2 != (void *)0xffffffffffffffff) && (pvVar3 = pvVar2, allocated != (size_t *)0x0)) {
    *allocated = __len;
  }
  return pvVar3;
}

Assistant:

void* OSUtils::allocVirtualMemory(size_t size, size_t* allocated, uint32_t flags) noexcept {
  const VMemInfo& vmi = OSUtils_GetVMemInfo();

  size_t alignedSize = Utils::alignTo<size_t>(size, vmi.pageSize);
  int protection = PROT_READ;

  if (flags & kVMWritable  ) protection |= PROT_WRITE;
  if (flags & kVMExecutable) protection |= PROT_EXEC;

  void* mbase = ::mmap(nullptr, alignedSize, protection, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
  if (ASMJIT_UNLIKELY(mbase == MAP_FAILED)) return nullptr;

  if (allocated) *allocated = alignedSize;
  return mbase;
}